

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_enum.c
# Opt level: O0

upb_MiniTableEnum *
upb_MiniTableEnum_Build(char *data,size_t len,upb_Arena *arena,upb_Status *status)

{
  size_t size;
  upb_MiniTableEnum *puVar1;
  char *local_138;
  undefined1 local_128 [8];
  upb_MdEnumDecoder decoder;
  uint32_t initial_capacity;
  upb_Status *status_local;
  upb_Arena *arena_local;
  size_t len_local;
  char *data_local;
  
  decoder._244_4_ = 2;
  memset(local_128,0,0xf8);
  local_138 = data;
  if (len != 0) {
    local_138 = data + len;
  }
  local_128 = (undefined1  [8])local_138;
  decoder.base.err[0].__saved_mask.__val[0xf] = (unsigned_long)arena;
  decoder.base.end = &status->ok;
  size = upb_MiniTableEnum_Size(decoder._244_4_);
  decoder.arena = (upb_Arena *)upb_Arena_Malloc(arena,size);
  decoder.enum_value_count = decoder._244_4_;
  puVar1 = upb_MtDecoder_BuildMiniTableEnum((upb_MdEnumDecoder *)local_128,data,len);
  return puVar1;
}

Assistant:

upb_MiniTableEnum* upb_MiniTableEnum_Build(const char* data, size_t len,
                                           upb_Arena* arena,
                                           upb_Status* status) {
  uint32_t initial_capacity = 2;
  upb_MdEnumDecoder decoder = {
      .base =
          {
              .end = UPB_PTRADD(data, len),
              .status = status,
          },
      .arena = arena,
      .enum_table =
          upb_Arena_Malloc(arena, upb_MiniTableEnum_Size(initial_capacity)),
      .enum_value_count = 0,
      .enum_data_count = 0,
      .enum_data_capacity = initial_capacity,
  };

  return upb_MtDecoder_BuildMiniTableEnum(&decoder, data, len);
}